

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFalse.c
# Opt level: O3

Gia_Man_t * Gia_ManFalseRebuildPath(Gia_Man_t *p,Vec_Int_t *vHooks,int fVerbose,int fVeryVerbose)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  Gia_Obj_t *pGVar6;
  uint uVar7;
  int iVar8;
  Gia_Man_t *p_00;
  size_t sVar9;
  char *pcVar10;
  Gia_Obj_t *pGVar11;
  Gia_Man_t *pGVar12;
  ulong uVar13;
  long lVar14;
  
  if ((long)vHooks->nSize < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
  }
  uVar1 = vHooks->pArray[(long)vHooks->nSize + -1];
  p_00 = Gia_ManStart((p->nObjs << 2) / 3);
  pcVar3 = p->pName;
  if (pcVar3 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar3);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar3);
  }
  p_00->pName = pcVar10;
  pcVar3 = p->pSpec;
  if (pcVar3 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar3);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar3);
  }
  p_00->pSpec = pcVar10;
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  Gia_ManHashAlloc(p_00);
  if (1 < p->nObjs) {
    uVar13 = 1;
    lVar14 = 0x14;
    do {
      pGVar4 = p->pObjs;
      uVar5 = *(ulong *)((long)pGVar4 + lVar14 + -8);
      uVar7 = (uint)uVar5;
      iVar8 = (int)(uVar5 & 0x1fffffff);
      if ((uVar5 & 0x1fffffff) == 0x1fffffff || (int)uVar7 < 0) {
        if ((uVar7 & 0x9fffffff) == 0x9fffffff) {
          pGVar11 = Gia_ManAppendObj(p_00);
          uVar5 = *(ulong *)pGVar11;
          *(ulong *)pGVar11 = uVar5 | 0x9fffffff;
          *(ulong *)pGVar11 =
               uVar5 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar6 = p_00->pObjs;
          if ((pGVar11 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar11)) {
LAB_0073d348:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar6) >> 2) * -0x55555555);
          pGVar6 = p_00->pObjs;
          if ((pGVar11 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar11)) goto LAB_0073d348;
          *(int *)(&pGVar4->field_0x0 + lVar14) =
               (int)((ulong)((long)pGVar11 - (long)pGVar6) >> 2) * 0x55555556;
        }
        else if ((int)uVar7 < 0 && iVar8 != 0x1fffffff) {
          uVar2 = *(uint *)((long)pGVar4 + lVar14 + (ulong)(uint)(iVar8 << 2) * -3);
          if ((int)uVar2 < 0) goto LAB_0073d367;
          iVar8 = Gia_ManAppendCo(p_00,uVar2 ^ uVar7 >> 0x1d & 1);
          goto LAB_0073d2f7;
        }
      }
      else if (uVar1 == uVar13) {
        Gia_ManFalseRebuildOne(p_00,p,vHooks,iVar8,fVeryVerbose);
      }
      else {
        uVar7 = *(uint *)((long)pGVar4 + lVar14 + (ulong)(uint)(iVar8 << 2) * -3);
        if (((int)uVar7 < 0) ||
           (uVar2 = *(uint *)((long)pGVar4 +
                             lVar14 + (ulong)((uint)(uVar5 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar2 < 0)) {
LAB_0073d367:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        iVar8 = Gia_ManHashAnd(p_00,uVar7 ^ (uint)(uVar5 >> 0x1d) & 1,
                               uVar2 ^ (uint)(uVar5 >> 0x3d) & 1);
LAB_0073d2f7:
        *(int *)(&pGVar4->field_0x0 + lVar14) = iVar8;
      }
      uVar13 = uVar13 + 1;
      lVar14 = lVar14 + 0xc;
    } while ((long)uVar13 < (long)p->nObjs);
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,p->nRegs);
  pGVar12 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar12;
}

Assistant:

Gia_Man_t * Gia_ManFalseRebuildPath( Gia_Man_t * p, Vec_Int_t * vHooks, int fVerbose, int fVeryVerbose )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, iPathEnd = Vec_IntEntryLast(vHooks);
    pNew = Gia_ManStart( 4 * Gia_ManObjNum(p) / 3 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue(p);
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
        {
            if ( iPathEnd == i )
                Gia_ManFalseRebuildOne( pNew, p, vHooks, fVerbose, fVeryVerbose );
            else
                pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        }
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}